

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerBreakpointManager.cxx
# Opt level: O2

int testDebuggerBreakpointManager(int param_1,char **param_2)

{
  int iVar1;
  long lVar2;
  initializer_list<std::function<bool_()>_> __l;
  allocator_type local_89;
  vector<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_> local_88;
  function<bool_()> local_70;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  code *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  
  local_70.super__Function_base._M_functor._8_8_ = 0;
  local_70.super__Function_base._M_functor._M_unused._M_object =
       testHandleBreakpointRequestBeforeFileIsLoaded;
  local_70._M_invoker = std::_Function_handler<bool_(),_bool_(*)()>::_M_invoke;
  local_70.super__Function_base._M_manager = std::_Function_handler<bool_(),_bool_(*)()>::_M_manager
  ;
  local_48 = 0;
  local_50 = testHandleBreakpointRequestAfterFileIsLoaded;
  local_38 = std::_Function_handler<bool_(),_bool_(*)()>::_M_invoke;
  local_40 = std::_Function_handler<bool_(),_bool_(*)()>::_M_manager;
  local_28 = 0;
  local_30 = testSourceFileLoadedAfterHandleBreakpointRequest;
  local_18 = std::_Function_handler<bool_(),_bool_(*)()>::_M_invoke;
  local_20 = std::_Function_handler<bool_(),_bool_(*)()>::_M_manager;
  __l._M_len = 3;
  __l._M_array = &local_70;
  std::vector<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_>::vector
            (&local_88,__l,&local_89);
  iVar1 = runTests(&local_88);
  std::vector<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_>::~vector(&local_88);
  lVar2 = 0x40;
  do {
    std::_Function_base::~_Function_base
              ((_Function_base *)((long)&local_70.super__Function_base._M_functor + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return iVar1;
}

Assistant:

int testDebuggerBreakpointManager(int, char*[])
{
  return runTests(std::vector<std::function<bool()>>{
    testHandleBreakpointRequestBeforeFileIsLoaded,
    testHandleBreakpointRequestAfterFileIsLoaded,
    testSourceFileLoadedAfterHandleBreakpointRequest,
  });
}